

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall
Js::JavascriptNativeIntArray::JavascriptNativeIntArray
          (JavascriptNativeIntArray *this,JavascriptNativeIntArray *instance,bool boxHead,
          bool deepCopy)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  DynamicObjectFlags DVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  undefined7 in_register_00000011;
  
  JavascriptNativeArray::JavascriptNativeArray
            (&this->super_JavascriptNativeArray,&instance->super_JavascriptNativeArray,deepCopy);
  (this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_014f6fc8;
  if ((int)CONCAT71(in_register_00000011,boxHead) != 0) {
    JavascriptArray::InitBoxedInlineSegments<Js::JavascriptNativeIntArray>
              ((JavascriptArray *)this,instance,deepCopy);
    return;
  }
  if ((this->super_JavascriptNativeArray).super_JavascriptArray.head.ptr !=
      (instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2ff9,"(head == instance->head)","head == instance->head");
    if (!bVar3) goto LAB_00b85611;
    *puVar5 = 0;
  }
  TVar1 = (this->super_JavascriptNativeArray).super_JavascriptArray.segmentUnion;
  DVar4 = DynamicObject::GetArrayFlags((DynamicObject *)instance);
  pTVar6 = (Type *)((long)(instance->super_JavascriptNativeArray).super_JavascriptArray.segmentUnion
                   + 0x20);
  if ((DVar4 & HasSegmentMap) == None) {
    pTVar6 = &(instance->super_JavascriptNativeArray).super_JavascriptArray.segmentUnion;
  }
  if (TVar1 != *pTVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2ffa,
                                "(segmentUnion.lastUsedSegment == instance->GetLastUsedSegment())",
                                "segmentUnion.lastUsedSegment == instance->GetLastUsedSegment()");
    if (!bVar3) {
LAB_00b85611:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

JavascriptNativeIntArray::JavascriptNativeIntArray(JavascriptNativeIntArray * instance, bool boxHead, bool deepCopy) :
        JavascriptNativeArray(instance, deepCopy)
    {
        if (boxHead)
        {
            InitBoxedInlineSegments(instance, deepCopy);
        }
        else
        {
            // Base class ctor should have copied these
            Assert(head == instance->head);
            Assert(segmentUnion.lastUsedSegment == instance->GetLastUsedSegment());
        }
    }